

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O0

size_t __thiscall
helics::tcp::TcpComms::dataReceive
          (TcpComms *this,TcpConnection *connection,char *data,size_t bytes_received)

{
  bool bVar1;
  action_t aVar2;
  size_t sVar3;
  size_t in_RCX;
  void *__buf;
  TcpConnection *in_RSI;
  ActionMessage *in_RDI;
  int in_R8D;
  system_error *anon_var_0;
  ActionMessage rep;
  size_t used;
  ActionMessage m;
  size_t used_total;
  TcpConnection *in_stack_fffffffffffffe08;
  ActionMessage *command;
  undefined1 local_1d0 [8];
  ActionMessage *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  ActionMessage *in_stack_fffffffffffffe48;
  ActionMessage *in_stack_fffffffffffffe50;
  ActionMessage *in_stack_fffffffffffffed0;
  NetworkCommsInterface *in_stack_fffffffffffffed8;
  int local_f8;
  ActionMessage local_e0;
  ulong local_28;
  ulong local_20;
  TcpConnection *local_10;
  
  local_28 = 0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  do {
    if (local_20 <= local_28) {
      return local_28;
    }
    command = &local_e0;
    ActionMessage::ActionMessage(in_RDI);
    sVar3 = ActionMessage::depacketize
                      (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
                      );
    if (sVar3 == 0) {
      local_f8 = 3;
    }
    else {
      bVar1 = isProtocolCommand(command);
      if (bVar1) {
        NetworkCommsInterface::generateReplyToIncomingMessage
                  (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        aVar2 = ActionMessage::action((ActionMessage *)&stack0xfffffffffffffe50);
        if (aVar2 == cmd_ignore) {
          gmlc::containers::
          BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
          push<helics::ActionMessage>
                    ((BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        }
        else {
          in_stack_fffffffffffffe08 = local_10;
          ActionMessage::packetize_abi_cxx11_(in_stack_fffffffffffffe38);
          gmlc::networking::TcpConnection::send
                    (in_stack_fffffffffffffe08,(int)local_1d0,__buf,in_RCX,in_R8D);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)command);
        }
        ActionMessage::~ActionMessage(command);
      }
      else {
        bVar1 = std::function::operator_cast_to_bool
                          ((function<void_(helics::ActionMessage_&&)> *)0x4a4a30);
        if (bVar1) {
          std::function<void_(helics::ActionMessage_&&)>::operator()
                    ((function<void_(helics::ActionMessage_&&)> *)command,
                     (ActionMessage *)in_stack_fffffffffffffe08);
        }
      }
      local_28 = sVar3 + local_28;
      local_f8 = 0;
    }
    ActionMessage::~ActionMessage(command);
  } while (local_f8 == 0);
  return local_28;
}

Assistant:

size_t TcpComms::dataReceive(gmlc::networking::TcpConnection* connection,
                             const char* data,
                             size_t bytes_received)
{
    size_t used_total = 0;
    while (used_total < bytes_received) {
        ActionMessage m;
        auto used = m.depacketize(reinterpret_cast<const std::byte*>(data) + used_total,
                                  bytes_received - used_total);
        if (used == 0) {
            break;
        }
        if (isProtocolCommand(m)) {
            // if the reply is not ignored respond with it otherwise
            // forward the original message on to the receiver to handle
            auto rep = generateReplyToIncomingMessage(m);
            if (rep.action() != CMD_IGNORE) {
                try {
                    connection->send(rep.packetize());
                }
                catch (const std::system_error&) {
                }
            } else {
                rxMessageQueue.push(std::move(m));
            }
        } else {
            if (ActionCallback) {
                ActionCallback(std::move(m));
            }
        }
        used_total += used;
    }

    return used_total;
}